

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError parse_output(OperationConfig *config,char *nextarg)

{
  ParameterError PVar1;
  getout *pgVar2;
  
  if (config->url_out == (getout *)0x0) {
    config->url_out = config->url_list;
  }
  if (config->url_out != (getout *)0x0) {
    pgVar2 = config->url_out;
    while ((pgVar2 != (getout *)0x0 && ((pgVar2->flags & 1) != 0))) {
      pgVar2 = pgVar2->next;
      config->url_out = pgVar2;
    }
  }
  pgVar2 = config->url_out;
  if (pgVar2 == (getout *)0x0) {
    pgVar2 = new_getout(config);
    config->url_out = pgVar2;
  }
  if (pgVar2 == (getout *)0x0) {
    PVar1 = PARAM_NO_MEM;
  }
  else {
    PVar1 = getstr(&pgVar2->outfile,nextarg,false);
    pgVar2->flags = (pgVar2->flags & 0xfffffffaU) + 1;
  }
  return PVar1;
}

Assistant:

static ParameterError parse_output(struct OperationConfig *config,
                                   const char *nextarg)
{
  ParameterError err = PARAM_OK;
  struct getout *url;

  /* output file */
  if(!config->url_out)
    config->url_out = config->url_list;
  if(config->url_out) {
    /* there is a node here, if it already is filled-in continue to find
       an "empty" node */
    while(config->url_out && (config->url_out->flags & GETOUT_OUTFILE))
      config->url_out = config->url_out->next;
  }

  /* now there might or might not be an available node to fill in! */

  if(config->url_out)
    /* existing node */
    url = config->url_out;
  else {
    /* there was no free node, create one! */
    config->url_out = url = new_getout(config);
  }

  if(!url)
    return PARAM_NO_MEM;

  /* fill in the outfile */
  err = getstr(&url->outfile, nextarg, DENY_BLANK);
  url->flags &= ~GETOUT_USEREMOTE; /* switch off */
  url->flags |= GETOUT_OUTFILE;
  return err;
}